

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallExportGenerator::GenerateScriptActions
          (cmInstallExportGenerator *this,ostream *os,Indent *indent)

{
  string *dest;
  int iVar1;
  ostream *poVar2;
  Indent indentN;
  Indent indentNN;
  Indent indentNNN;
  string installedFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string installedDir;
  
  std::__cxx11::string::string((string *)&installedDir,"$ENV{DESTDIR}",(allocator *)&installedFile);
  dest = &(this->super_cmInstallGenerator).Destination;
  cmInstallGenerator::ConvertToAbsoluteDestination
            (&installedFile,&this->super_cmInstallGenerator,dest);
  std::__cxx11::string::append((string *)&installedDir);
  std::__cxx11::string::~string((string *)&installedFile);
  std::__cxx11::string::append((char *)&installedDir);
  std::__cxx11::string::string((string *)&installedFile,(string *)&installedDir);
  std::__cxx11::string::append((string *)&installedFile);
  cmScriptGeneratorIndent::Write(indent,os);
  poVar2 = std::operator<<(os,"if(EXISTS \"");
  poVar2 = std::operator<<(poVar2,(string *)&installedFile);
  std::operator<<(poVar2,"\")\n");
  iVar1 = indent->Level;
  indentN.Level = iVar1 + 2;
  indentNN.Level = iVar1 + 4;
  indentNNN.Level = iVar1 + 6;
  cmScriptGeneratorIndent::Write(&indentN,os);
  poVar2 = std::operator<<(os,"file(DIFFERENT EXPORT_FILE_CHANGED FILES\n");
  cmScriptGeneratorIndent::Write(&indentN,poVar2);
  poVar2 = std::operator<<(poVar2,"     \"");
  poVar2 = std::operator<<(poVar2,(string *)&installedFile);
  poVar2 = std::operator<<(poVar2,"\"\n");
  cmScriptGeneratorIndent::Write(&indentN,poVar2);
  poVar2 = std::operator<<(poVar2,"     \"");
  poVar2 = std::operator<<(poVar2,(string *)&this->MainImportFile);
  std::operator<<(poVar2,"\")\n");
  cmScriptGeneratorIndent::Write(&indentN,os);
  std::operator<<(os,"if(EXPORT_FILE_CHANGED)\n");
  cmScriptGeneratorIndent::Write(&indentNN,os);
  poVar2 = std::operator<<(os,"file(GLOB OLD_CONFIG_FILES \"");
  poVar2 = std::operator<<(poVar2,(string *)&installedDir);
  cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_((string *)&files,this->EFGen);
  poVar2 = std::operator<<(poVar2,(string *)&files);
  std::operator<<(poVar2,"\")\n");
  std::__cxx11::string::~string((string *)&files);
  cmScriptGeneratorIndent::Write(&indentNN,os);
  std::operator<<(os,"if(OLD_CONFIG_FILES)\n");
  cmScriptGeneratorIndent::Write(&indentNNN,os);
  poVar2 = std::operator<<(os,"message(STATUS \"Old export file \\\"");
  poVar2 = std::operator<<(poVar2,(string *)&installedFile);
  std::operator<<(poVar2,"\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n");
  cmScriptGeneratorIndent::Write(&indentNNN,os);
  std::operator<<(os,"file(REMOVE ${OLD_CONFIG_FILES})\n");
  cmScriptGeneratorIndent::Write(&indentNN,os);
  std::operator<<(os,"endif()\n");
  cmScriptGeneratorIndent::Write(&indentN,os);
  std::operator<<(os,"endif()\n");
  cmScriptGeneratorIndent::Write(indent,os);
  std::operator<<(os,"endif()\n");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&files,&this->MainImportFile);
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,dest,cmInstallType_FILES,&files,false,
             (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,indent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  std::__cxx11::string::~string((string *)&installedFile);
  std::__cxx11::string::~string((string *)&installedDir);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptActions(std::ostream& os,
                                                     Indent const& indent)
{
  // Remove old per-configuration export files if the main changes.
  std::string installedDir = "$ENV{DESTDIR}";
  installedDir += this->ConvertToAbsoluteDestination(this->Destination);
  installedDir += "/";
  std::string installedFile = installedDir;
  installedFile += this->FileName;
  os << indent << "if(EXISTS \"" << installedFile << "\")\n";
  Indent indentN = indent.Next();
  Indent indentNN = indentN.Next();
  Indent indentNNN = indentNN.Next();
  os << indentN << "file(DIFFERENT EXPORT_FILE_CHANGED FILES\n"
     << indentN << "     \"" << installedFile << "\"\n"
     << indentN << "     \"" << this->MainImportFile << "\")\n";
  os << indentN << "if(EXPORT_FILE_CHANGED)\n";
  os << indentNN << "file(GLOB OLD_CONFIG_FILES \"" << installedDir
     << this->EFGen->GetConfigImportFileGlob() << "\")\n";
  os << indentNN << "if(OLD_CONFIG_FILES)\n";
  os << indentNNN << "message(STATUS \"Old export file \\\"" << installedFile
     << "\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n";
  os << indentNNN << "file(REMOVE ${OLD_CONFIG_FILES})\n";
  os << indentNN << "endif()\n";
  os << indentN << "endif()\n";
  os << indent << "endif()\n";

  // Install the main export file.
  std::vector<std::string> files;
  files.push_back(this->MainImportFile);
  this->AddInstallRule(os, this->Destination,
                       cmInstallType_FILES, files, false,
                       this->FilePermissions.c_str(), 0, 0, 0, indent);
}